

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O2

bool comparesEqual(QString *s1,char16_t *s2)

{
  bool bVar1;
  long in_FS_OFFSET;
  QStringView local_40;
  QStringView local_30;
  char16_t *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.m_data = (s1->d).ptr;
  local_30.m_size = (s1->d).size;
  local_20 = s2;
  QStringView::QStringView<const_char16_t_*,_true>(&local_40,&local_20);
  bVar1 = comparesEqual(&local_30,&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool comparesEqual(const QString &s1, const char16_t *s2) noexcept
    { return comparesEqual(s1, QStringView(s2)); }